

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCopyMemory(ValidationState_t *_,Instruction *inst)

{
  ulong uVar1;
  Instruction *this;
  Instruction *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  Op OVar5;
  uint uVar6;
  uint32_t uVar7;
  spv_result_t sVar8;
  DiagnosticStream *pDVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  size_type sVar11;
  byte local_20cd;
  byte local_20cc;
  byte local_20cb;
  byte local_20ca;
  byte local_20c9;
  DiagnosticStream local_2000;
  Instruction *local_1e28;
  Instruction *sub_type;
  spv_result_t error_2;
  spv_result_t error_1;
  DiagnosticStream local_1c40;
  byte local_1a67;
  byte local_1a66;
  bool local_1a65;
  bool local_1a64;
  undefined1 local_1a63;
  byte local_1a62;
  byte local_1a61;
  byte local_1a60;
  bool target_int8_match;
  bool source_int8_match;
  bool target_int16_match;
  bool source_int16_match;
  bool wg_int16;
  bool io_int16;
  bool pc_int16;
  bool ssbo_int16;
  bool ubo_int16;
  bool int16;
  bool wg_int8;
  bool pc_int8;
  bool ssbo_int8;
  bool ubo_int8;
  bool int8;
  StorageClass target_sc;
  StorageClass source_sc;
  tuple<bool,_bool,_unsigned_int> local_1a38;
  uint local_1a30;
  bool local_1a2a;
  bool local_1a29;
  uint32_t value;
  bool is_const;
  bool is_int;
  DiagnosticStream local_1a08;
  ulong local_1830;
  size_t i;
  DiagnosticStream local_1808;
  string local_1630;
  DiagnosticStream local_1610;
  byte local_1431;
  undefined1 local_1430 [7];
  bool is_zero;
  DiagnosticStream local_1410;
  Instruction *local_1238;
  Instruction *size_type;
  DiagnosticStream local_1210;
  Instruction *local_1038;
  Instruction *size;
  uint size_id;
  spv_result_t error;
  string local_e50;
  string local_e30;
  DiagnosticStream local_e10;
  string local_c38;
  DiagnosticStream local_c18;
  string local_a40;
  DiagnosticStream local_a20;
  Instruction *local_848;
  Instruction *source_type;
  Instruction *target_type;
  undefined1 local_830 [6];
  bool source_typed;
  bool target_typed;
  DiagnosticStream local_810;
  Instruction *local_638;
  Instruction *source_pointer_type;
  DiagnosticStream local_610;
  Instruction *local_438;
  Instruction *target_pointer_type;
  DiagnosticStream local_410;
  Instruction *local_238;
  Instruction *source;
  uint source_id;
  int source_index;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *target;
  uint target_id;
  int target_index;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  target._4_4_ = 0;
  _target_id = (Instruction *)inst;
  inst_local = (Instruction *)_;
  target._0_4_ = val::Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)target);
  if (local_30 == (Instruction *)0x0) {
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_target_id);
    pDVar9 = DiagnosticStream::operator<<(&local_208,(char (*) [21])"Target operand <id> ");
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)&source_id,(ValidationState_t *)inst_local,(uint)target);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &source_id);
    pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [17])0xd1ba5b);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
    std::__cxx11::string::~string((string *)&source_id);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  else {
    source._4_4_ = 1;
    source._0_4_ = val::Instruction::GetOperandAs<unsigned_int>(_target_id,1);
    local_238 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)source);
    pIVar2 = inst_local;
    if (local_238 == (Instruction *)0x0) {
      ValidationState_t::diag
                (&local_410,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_target_id);
      pDVar9 = DiagnosticStream::operator<<(&local_410,(char (*) [21])"Source operand <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&target_pointer_type,(ValidationState_t *)inst_local,(uint)source);
      pDVar9 = DiagnosticStream::operator<<
                         (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&target_pointer_type);
      pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [17])0xd1ba5b);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
      std::__cxx11::string::~string((string *)&target_pointer_type);
      DiagnosticStream::~DiagnosticStream(&local_410);
    }
    else {
      uVar4 = val::Instruction::type_id(local_30);
      local_438 = ValidationState_t::FindDef((ValidationState_t *)pIVar2,uVar4);
      if ((local_438 == (Instruction *)0x0) ||
         ((OVar5 = val::Instruction::opcode(local_438), OVar5 != OpTypePointer &&
          (OVar5 = val::Instruction::opcode(local_438), OVar5 != OpTypeUntypedPointerKHR)))) {
        ValidationState_t::diag
                  (&local_610,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_target_id);
        pDVar9 = DiagnosticStream::operator<<(&local_610,(char (*) [21])"Target operand <id> ");
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)&source_pointer_type,(ValidationState_t *)inst_local,(uint)target);
        pDVar9 = DiagnosticStream::operator<<
                           (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&source_pointer_type);
        pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [19])0xcfb665);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        std::__cxx11::string::~string((string *)&source_pointer_type);
        DiagnosticStream::~DiagnosticStream(&local_610);
      }
      else {
        pIVar2 = inst_local;
        uVar4 = val::Instruction::type_id(local_238);
        local_638 = ValidationState_t::FindDef((ValidationState_t *)pIVar2,uVar4);
        if ((local_638 == (Instruction *)0x0) ||
           ((OVar5 = val::Instruction::opcode(local_638), OVar5 != OpTypePointer &&
            (OVar5 = val::Instruction::opcode(local_638), OVar5 != OpTypeUntypedPointerKHR)))) {
          ValidationState_t::diag
                    (&local_810,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_target_id);
          pDVar9 = DiagnosticStream::operator<<(&local_810,(char (*) [21])"Source operand <id> ");
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)local_830,(ValidationState_t *)inst_local,(uint)source);
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_830);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [19])0xcfb665);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          std::__cxx11::string::~string((string *)local_830);
          DiagnosticStream::~DiagnosticStream(&local_810);
        }
        else {
          OVar5 = val::Instruction::opcode(_target_id);
          if (OVar5 == OpCopyMemory) {
            OVar5 = val::Instruction::opcode(local_438);
            target_type._7_1_ = OVar5 == OpTypePointer;
            OVar5 = val::Instruction::opcode(local_638);
            pIVar2 = inst_local;
            target_type._6_1_ = OVar5 == OpTypePointer;
            source_type = (Instruction *)0x0;
            local_848 = (Instruction *)0x0;
            if ((target_type._7_1_ & 1) != 0) {
              uVar6 = val::Instruction::GetOperandAs<unsigned_int>(local_438,2);
              source_type = (Instruction *)
                            ValidationState_t::FindDef((ValidationState_t *)pIVar2,uVar6);
              if (((Instruction *)source_type == (Instruction *)0x0) ||
                 (OVar5 = val::Instruction::opcode((Instruction *)source_type), OVar5 == OpTypeVoid)
                 ) {
                ValidationState_t::diag
                          (&local_a20,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                           _target_id);
                pDVar9 = DiagnosticStream::operator<<
                                   (&local_a20,(char (*) [21])"Target operand <id> ");
                ValidationState_t::getIdName_abi_cxx11_
                          (&local_a40,(ValidationState_t *)inst_local,(uint)target);
                pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_a40);
                pDVar9 = DiagnosticStream::operator<<
                                   (pDVar9,(char (*) [27])" cannot be a void pointer.");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
                std::__cxx11::string::~string((string *)&local_a40);
                DiagnosticStream::~DiagnosticStream(&local_a20);
                return __local._4_4_;
              }
            }
            pIVar2 = inst_local;
            if ((target_type._6_1_ & 1) != 0) {
              uVar6 = val::Instruction::GetOperandAs<unsigned_int>(local_638,2);
              local_848 = ValidationState_t::FindDef((ValidationState_t *)pIVar2,uVar6);
              if ((local_848 == (Instruction *)0x0) ||
                 (OVar5 = val::Instruction::opcode(local_848), OVar5 == OpTypeVoid)) {
                ValidationState_t::diag
                          (&local_c18,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                           _target_id);
                pDVar9 = DiagnosticStream::operator<<
                                   (&local_c18,(char (*) [21])"Source operand <id> ");
                ValidationState_t::getIdName_abi_cxx11_
                          (&local_c38,(ValidationState_t *)inst_local,(uint)source);
                pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_c38);
                pDVar9 = DiagnosticStream::operator<<
                                   (pDVar9,(char (*) [27])" cannot be a void pointer.");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
                std::__cxx11::string::~string((string *)&local_c38);
                DiagnosticStream::~DiagnosticStream(&local_c18);
                return __local._4_4_;
              }
            }
            if ((source_type != (Instruction *)0x0) && (local_848 != (Instruction *)0x0)) {
              uVar4 = val::Instruction::id((Instruction *)source_type);
              uVar7 = val::Instruction::id(local_848);
              if (uVar4 != uVar7) {
                ValidationState_t::diag
                          (&local_e10,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                           _target_id);
                pDVar9 = DiagnosticStream::operator<<(&local_e10,(char (*) [13])0xd1c789);
                ValidationState_t::getIdName_abi_cxx11_
                          (&local_e30,(ValidationState_t *)inst_local,(uint)source);
                pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_e30);
                pDVar9 = DiagnosticStream::operator<<
                                   (pDVar9,(char (*) [35])"s type does not match Source <id> ");
                pIVar2 = inst_local;
                uVar4 = val::Instruction::id(local_848);
                ValidationState_t::getIdName_abi_cxx11_
                          (&local_e50,(ValidationState_t *)pIVar2,uVar4);
                pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_e50);
                pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [8])"s type.");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
                std::__cxx11::string::~string((string *)&local_e50);
                std::__cxx11::string::~string((string *)&local_e30);
                DiagnosticStream::~DiagnosticStream(&local_e10);
                return __local._4_4_;
              }
            }
            if ((source_type == (Instruction *)0x0) && (local_848 == (Instruction *)0x0)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&size_id,(ValidationState_t *)inst_local,
                         SPV_ERROR_INVALID_ID,_target_id);
              pDVar9 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)&size_id,
                                  (char (*) [48])"One of Source or Target must be a typed pointer");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&size_id);
              return __local._4_4_;
            }
            sVar8 = CheckMemoryAccess((ValidationState_t *)inst_local,(Instruction *)_target_id,2);
            if (sVar8 != SPV_SUCCESS) {
              return sVar8;
            }
            size._4_4_ = 0;
          }
          else {
            size._0_4_ = val::Instruction::GetOperandAs<unsigned_int>(_target_id,2);
            local_1038 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)size);
            pIVar2 = inst_local;
            if (local_1038 == (Instruction *)0x0) {
              ValidationState_t::diag
                        (&local_1210,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_target_id
                        );
              pDVar9 = DiagnosticStream::operator<<(&local_1210,(char (*) [19])"Size operand <id> ")
              ;
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)&size_type,(ValidationState_t *)inst_local,(uint)size);
              pDVar9 = DiagnosticStream::operator<<
                                 (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&size_type);
              pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [17])0xd1ba5b);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
              std::__cxx11::string::~string((string *)&size_type);
              DiagnosticStream::~DiagnosticStream(&local_1210);
              return __local._4_4_;
            }
            uVar4 = val::Instruction::type_id(local_1038);
            local_1238 = ValidationState_t::FindDef((ValidationState_t *)pIVar2,uVar4);
            pIVar2 = inst_local;
            uVar4 = val::Instruction::id(local_1238);
            bVar3 = ValidationState_t::IsIntScalarType((ValidationState_t *)pIVar2,uVar4);
            if (!bVar3) {
              ValidationState_t::diag
                        (&local_1410,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_target_id
                        );
              pDVar9 = DiagnosticStream::operator<<(&local_1410,(char (*) [19])"Size operand <id> ")
              ;
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)local_1430,(ValidationState_t *)inst_local,(uint)size);
              pDVar9 = DiagnosticStream::operator<<
                                 (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1430);
              pDVar9 = DiagnosticStream::operator<<
                                 (pDVar9,(char (*) [32])" must be a scalar integer type.");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
              std::__cxx11::string::~string((string *)local_1430);
              DiagnosticStream::~DiagnosticStream(&local_1410);
              return __local._4_4_;
            }
            local_1431 = 1;
            OVar5 = val::Instruction::opcode(local_1038);
            if (OVar5 == OpConstant) {
              uVar4 = val::Instruction::word(local_1238,3);
              this = local_1038;
              if (uVar4 == 1) {
                pvVar10 = val::Instruction::words(local_1038);
                sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
                uVar4 = val::Instruction::word(this,sVar11 - 1);
                if ((uVar4 & 0x80000000) != 0) {
                  ValidationState_t::diag
                            (&local_1808,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                             _target_id);
                  pDVar9 = DiagnosticStream::operator<<
                                     (&local_1808,(char (*) [19])"Size operand <id> ");
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&i,(ValidationState_t *)inst_local,(uint)size);
                  pDVar9 = DiagnosticStream::operator<<
                                     (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&i);
                  pDVar9 = DiagnosticStream::operator<<
                                     (pDVar9,(char (*) [36])" cannot have the sign bit set to 1.");
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
                  std::__cxx11::string::~string((string *)&i);
                  DiagnosticStream::~DiagnosticStream(&local_1808);
                  return __local._4_4_;
                }
              }
              local_1830 = 3;
              while( true ) {
                uVar1 = local_1830;
                bVar3 = false;
                if ((local_1431 & 1) != 0) {
                  pvVar10 = val::Instruction::words(local_1038);
                  sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
                  bVar3 = uVar1 < sVar11;
                }
                if (!bVar3) break;
                uVar4 = val::Instruction::word(local_1038,local_1830);
                local_1431 = (local_1431 & 1 & uVar4 == 0) != 0;
                local_1830 = local_1830 + 1;
              }
              if ((local_1431 & 1) != 0) {
                ValidationState_t::diag
                          (&local_1a08,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                           _target_id);
                pDVar9 = DiagnosticStream::operator<<
                                   (&local_1a08,(char (*) [19])"Size operand <id> ");
                ValidationState_t::getIdName_abi_cxx11_
                          ((string *)&value,(ValidationState_t *)inst_local,(uint)size);
                pDVar9 = DiagnosticStream::operator<<
                                   (pDVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&value);
                pDVar9 = DiagnosticStream::operator<<
                                   (pDVar9,(char (*) [28])" cannot be a constant zero.");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
                std::__cxx11::string::~string((string *)&value);
                DiagnosticStream::~DiagnosticStream(&local_1a08);
                return __local._4_4_;
              }
            }
            else if (OVar5 == OpConstantNull) {
              ValidationState_t::diag
                        (&local_1610,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_target_id
                        );
              pDVar9 = DiagnosticStream::operator<<(&local_1610,(char (*) [19])"Size operand <id> ")
              ;
              ValidationState_t::getIdName_abi_cxx11_
                        (&local_1630,(ValidationState_t *)inst_local,(uint)size);
              pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_1630);
              pDVar9 = DiagnosticStream::operator<<
                                 (pDVar9,(char (*) [28])" cannot be a constant zero.");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
              std::__cxx11::string::~string((string *)&local_1630);
              DiagnosticStream::~DiagnosticStream(&local_1610);
              return __local._4_4_;
            }
            bVar3 = ValidationState_t::HasCapability
                              ((ValidationState_t *)inst_local,CapabilityShader);
            if (bVar3) {
              local_1a29 = false;
              local_1a2a = false;
              local_1a30 = 0;
              ValidationState_t::EvalInt32IfConst
                        (&local_1a38,(ValidationState_t *)inst_local,(uint)size);
              std::tie<bool,bool,unsigned_int>
                        ((tuple<bool_&,_bool_&,_unsigned_int_&> *)&target_sc,&local_1a29,&local_1a2a
                         ,&local_1a30);
              std::tuple<bool&,bool&,unsigned_int&>::operator=
                        ((tuple<bool&,bool&,unsigned_int&> *)&target_sc,&local_1a38);
              if (((local_1a2a & 1U) != 0) && ((local_1a30 & 3) != 0)) {
                _pc_int8 = val::Instruction::GetOperandAs<spv::StorageClass>(local_638,1);
                _ssbo_int16 = val::Instruction::GetOperandAs<spv::StorageClass>(local_438,1);
                pc_int16 = ValidationState_t::HasCapability
                                     ((ValidationState_t *)inst_local,CapabilityInt8);
                io_int16 = ValidationState_t::HasCapability
                                     ((ValidationState_t *)inst_local,
                                      CapabilityUniformAndStorageBuffer8BitAccess);
                bVar3 = ValidationState_t::HasCapability
                                  ((ValidationState_t *)inst_local,CapabilityStorageBuffer8BitAccess
                                  );
                local_20c9 = 1;
                if (!bVar3) {
                  local_20c9 = io_int16;
                }
                wg_int16 = (bool)(local_20c9 & 1);
                source_int16_match =
                     ValidationState_t::HasCapability
                               ((ValidationState_t *)inst_local,CapabilityStoragePushConstant8);
                target_int16_match =
                     ValidationState_t::HasCapability
                               ((ValidationState_t *)inst_local,
                                CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR);
                bVar3 = ValidationState_t::HasCapability
                                  ((ValidationState_t *)inst_local,CapabilityInt16);
                local_20ca = 1;
                if (!bVar3) {
                  local_20ca = pc_int16;
                }
                source_int8_match = (bool)(local_20ca & 1);
                bVar3 = ValidationState_t::HasCapability
                                  ((ValidationState_t *)inst_local,CapabilityStorageUniform16);
                local_20cb = 1;
                if (!bVar3) {
                  local_20cb = io_int16;
                }
                target_int8_match = (bool)(local_20cb & 1);
                bVar3 = ValidationState_t::HasCapability
                                  ((ValidationState_t *)inst_local,
                                   CapabilityStorageBuffer16BitAccess);
                local_20cc = 1;
                if ((!bVar3) && (local_20cc = 1, (target_int8_match & 1U) == 0)) {
                  local_20cc = wg_int16;
                }
                local_1a60 = local_20cc & 1;
                bVar3 = ValidationState_t::HasCapability
                                  ((ValidationState_t *)inst_local,CapabilityStoragePushConstant16);
                local_20cd = 1;
                if (!bVar3) {
                  local_20cd = source_int16_match;
                }
                local_1a61 = local_20cd & 1;
                local_1a62 = ValidationState_t::HasCapability
                                       ((ValidationState_t *)inst_local,
                                        CapabilityStorageInputOutput16);
                local_1a63 = ValidationState_t::HasCapability
                                       ((ValidationState_t *)inst_local,
                                        CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR);
                local_1a64 = false;
                local_1a65 = false;
                local_1a66 = 0;
                local_1a67 = 0;
                switch(_pc_int8) {
                case Input:
                case Output:
                  local_1a64 = (bool)(local_1a62 & 1);
                  break;
                case StorageClassUniform:
                  local_1a64 = (bool)(target_int8_match & 1);
                  local_1a66 = io_int16 & 1;
                  break;
                case StorageClassWorkgroup:
                  local_1a66 = target_int16_match & 1;
                  local_1a64 = (bool)local_1a63;
                  break;
                default:
                  break;
                case PushConstant:
                  local_1a66 = source_int16_match & 1;
                  local_1a64 = (bool)(local_1a61 & 1);
                  break;
                case StorageBuffer:
                  local_1a66 = wg_int16 & 1;
                  local_1a64 = (bool)(local_1a60 & 1);
                }
                switch(_ssbo_int16) {
                case StorageClassUniform:
                  local_1a65 = (bool)(target_int8_match & 1);
                  local_1a67 = io_int16 & 1;
                  break;
                case Output:
                  local_1a65 = (bool)(local_1a62 & 1);
                  break;
                case StorageClassWorkgroup:
                  local_1a67 = target_int16_match & 1;
                  local_1a65 = (bool)local_1a63;
                  break;
                default:
                  break;
                case PushConstant:
                  local_1a67 = source_int16_match & 1;
                  local_1a65 = (bool)(local_1a61 & 1);
                  break;
                case StorageBuffer:
                  local_1a67 = wg_int16 & 1;
                  local_1a65 = (bool)(local_1a60 & 1);
                }
                if ((((pc_int16 & 1U) == 0) && ((source_int8_match & 1U) == 0)) &&
                   ((local_1a64 == false || (local_1a65 == false)))) {
                  ValidationState_t::diag
                            (&local_1c40,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                             _target_id);
                  pDVar9 = DiagnosticStream::operator<<
                                     (&local_1c40,(char (*) [29])"Size must be a multiple of 4");
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
                  DiagnosticStream::~DiagnosticStream(&local_1c40);
                  return __local._4_4_;
                }
                if ((((local_1a30 & 1) != 0) && ((pc_int16 & 1U) == 0)) &&
                   ((local_1a66 == 0 || (local_1a67 == 0)))) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&error_2,(ValidationState_t *)inst_local,
                             SPV_ERROR_INVALID_ID,_target_id);
                  pDVar9 = DiagnosticStream::operator<<
                                     ((DiagnosticStream *)&error_2,
                                      (char (*) [29])"Size must be a multiple of 2");
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_2);
                  return __local._4_4_;
                }
              }
            }
            sVar8 = CheckMemoryAccess((ValidationState_t *)inst_local,(Instruction *)_target_id,3);
            if (sVar8 != SPV_SUCCESS) {
              return sVar8;
            }
            sub_type._4_4_ = 0;
          }
          sub_type._0_4_ =
               ValidateCopyMemoryMemoryAccess
                         ((ValidationState_t *)inst_local,(Instruction *)_target_id);
          __local._4_4_ = (spv_result_t)sub_type;
          if ((spv_result_t)sub_type == SPV_SUCCESS) {
            OVar5 = val::Instruction::opcode(local_438);
            pIVar2 = inst_local;
            if (OVar5 == OpTypePointer) {
              uVar6 = val::Instruction::GetOperandAs<unsigned_int>(local_438,2);
              local_1e28 = ValidationState_t::FindDef((ValidationState_t *)pIVar2,uVar6);
              while (OVar5 = val::Instruction::opcode(local_1e28), pIVar2 = inst_local,
                    OVar5 == OpTypePointer) {
                uVar6 = val::Instruction::GetOperandAs<unsigned_int>(local_1e28,2);
                local_1e28 = ValidationState_t::FindDef((ValidationState_t *)pIVar2,uVar6);
              }
              bVar3 = ValidationState_t::HasCapability
                                ((ValidationState_t *)inst_local,CapabilityShader);
              pIVar2 = inst_local;
              if (bVar3) {
                uVar4 = val::Instruction::id(local_1e28);
                bVar3 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                  ((ValidationState_t *)pIVar2,uVar4);
                if (bVar3) {
                  ValidationState_t::diag
                            (&local_2000,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                             _target_id);
                  pDVar9 = DiagnosticStream::operator<<
                                     (&local_2000,
                                      (char (*) [60])
                                      "Cannot copy memory of objects containing 8- or 16-bit types")
                  ;
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
                  DiagnosticStream::~DiagnosticStream(&local_2000);
                  return __local._4_4_;
                }
              }
            }
            __local._4_4_ = SPV_SUCCESS;
          }
        }
      }
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateCopyMemory(ValidationState_t& _, const Instruction* inst) {
  const auto target_index = 0;
  const auto target_id = inst->GetOperandAs<uint32_t>(target_index);
  const auto target = _.FindDef(target_id);
  if (!target) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Target operand <id> " << _.getIdName(target_id)
           << " is not defined.";
  }

  const auto source_index = 1;
  const auto source_id = inst->GetOperandAs<uint32_t>(source_index);
  const auto source = _.FindDef(source_id);
  if (!source) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Source operand <id> " << _.getIdName(source_id)
           << " is not defined.";
  }

  const auto target_pointer_type = _.FindDef(target->type_id());
  if (!target_pointer_type ||
      (target_pointer_type->opcode() != spv::Op::OpTypePointer &&
       target_pointer_type->opcode() != spv::Op::OpTypeUntypedPointerKHR)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Target operand <id> " << _.getIdName(target_id)
           << " is not a pointer.";
  }

  const auto source_pointer_type = _.FindDef(source->type_id());
  if (!source_pointer_type ||
      (source_pointer_type->opcode() != spv::Op::OpTypePointer &&
       source_pointer_type->opcode() != spv::Op::OpTypeUntypedPointerKHR)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Source operand <id> " << _.getIdName(source_id)
           << " is not a pointer.";
  }

  if (inst->opcode() == spv::Op::OpCopyMemory) {
    const bool target_typed =
        target_pointer_type->opcode() == spv::Op::OpTypePointer;
    const bool source_typed =
        source_pointer_type->opcode() == spv::Op::OpTypePointer;
    Instruction* target_type = nullptr;
    Instruction* source_type = nullptr;
    if (target_typed) {
      target_type = _.FindDef(target_pointer_type->GetOperandAs<uint32_t>(2));

      if (!target_type || target_type->opcode() == spv::Op::OpTypeVoid) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "Target operand <id> " << _.getIdName(target_id)
               << " cannot be a void pointer.";
      }
    }

    if (source_typed) {
      source_type = _.FindDef(source_pointer_type->GetOperandAs<uint32_t>(2));
      if (!source_type || source_type->opcode() == spv::Op::OpTypeVoid) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "Source operand <id> " << _.getIdName(source_id)
               << " cannot be a void pointer.";
      }
    }

    if (target_type && source_type && target_type->id() != source_type->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Target <id> " << _.getIdName(source_id)
             << "s type does not match Source <id> "
             << _.getIdName(source_type->id()) << "s type.";
    }

    if (!target_type && !source_type) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "One of Source or Target must be a typed pointer";
    }

    if (auto error = CheckMemoryAccess(_, inst, 2)) return error;
  } else {
    const auto size_id = inst->GetOperandAs<uint32_t>(2);
    const auto size = _.FindDef(size_id);
    if (!size) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Size operand <id> " << _.getIdName(size_id)
             << " is not defined.";
    }

    const auto size_type = _.FindDef(size->type_id());
    if (!_.IsIntScalarType(size_type->id())) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Size operand <id> " << _.getIdName(size_id)
             << " must be a scalar integer type.";
    }
    bool is_zero = true;
    switch (size->opcode()) {
      case spv::Op::OpConstantNull:
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "Size operand <id> " << _.getIdName(size_id)
               << " cannot be a constant zero.";
      case spv::Op::OpConstant:
        if (size_type->word(3) == 1 &&
            size->word(size->words().size() - 1) & 0x80000000) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Size operand <id> " << _.getIdName(size_id)
                 << " cannot have the sign bit set to 1.";
        }
        for (size_t i = 3; is_zero && i < size->words().size(); ++i) {
          is_zero &= (size->word(i) == 0);
        }
        if (is_zero) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Size operand <id> " << _.getIdName(size_id)
                 << " cannot be a constant zero.";
        }
        break;
      default:
        // Cannot infer any other opcodes.
        break;
    }

    if (_.HasCapability(spv::Capability::Shader)) {
      bool is_int = false;
      bool is_const = false;
      uint32_t value = 0;
      std::tie(is_int, is_const, value) = _.EvalInt32IfConst(size_id);
      if (is_const) {
        if (value % 4 != 0) {
          const auto source_sc =
              source_pointer_type->GetOperandAs<spv::StorageClass>(1);
          const auto target_sc =
              target_pointer_type->GetOperandAs<spv::StorageClass>(1);
          const bool int8 = _.HasCapability(spv::Capability::Int8);
          const bool ubo_int8 = _.HasCapability(
              spv::Capability::UniformAndStorageBuffer8BitAccess);
          const bool ssbo_int8 =
              _.HasCapability(spv::Capability::StorageBuffer8BitAccess) ||
              ubo_int8;
          const bool pc_int8 =
              _.HasCapability(spv::Capability::StoragePushConstant8);
          const bool wg_int8 = _.HasCapability(
              spv::Capability::WorkgroupMemoryExplicitLayout8BitAccessKHR);
          const bool int16 = _.HasCapability(spv::Capability::Int16) || int8;
          const bool ubo_int16 =
              _.HasCapability(
                  spv::Capability::UniformAndStorageBuffer16BitAccess) ||
              ubo_int8;
          const bool ssbo_int16 =
              _.HasCapability(spv::Capability::StorageBuffer16BitAccess) ||
              ubo_int16 || ssbo_int8;
          const bool pc_int16 =
              _.HasCapability(spv::Capability::StoragePushConstant16) ||
              pc_int8;
          const bool io_int16 =
              _.HasCapability(spv::Capability::StorageInputOutput16);
          const bool wg_int16 = _.HasCapability(
              spv::Capability::WorkgroupMemoryExplicitLayout16BitAccessKHR);

          bool source_int16_match = false;
          bool target_int16_match = false;
          bool source_int8_match = false;
          bool target_int8_match = false;
          switch (source_sc) {
            case spv::StorageClass::StorageBuffer:
              source_int16_match = ssbo_int16;
              source_int8_match = ssbo_int8;
              break;
            case spv::StorageClass::Uniform:
              source_int16_match = ubo_int16;
              source_int8_match = ubo_int8;
              break;
            case spv::StorageClass::PushConstant:
              source_int16_match = pc_int16;
              source_int8_match = pc_int8;
              break;
            case spv::StorageClass::Input:
            case spv::StorageClass::Output:
              source_int16_match = io_int16;
              break;
            case spv::StorageClass::Workgroup:
              source_int16_match = wg_int16;
              source_int8_match = wg_int8;
              break;
            default:
              break;
          }
          switch (target_sc) {
            case spv::StorageClass::StorageBuffer:
              target_int16_match = ssbo_int16;
              target_int8_match = ssbo_int8;
              break;
            case spv::StorageClass::Uniform:
              target_int16_match = ubo_int16;
              target_int8_match = ubo_int8;
              break;
            case spv::StorageClass::PushConstant:
              target_int16_match = pc_int16;
              target_int8_match = pc_int8;
              break;
            // Input is read-only so it cannot be the target pointer.
            case spv::StorageClass::Output:
              target_int16_match = io_int16;
              break;
            case spv::StorageClass::Workgroup:
              target_int16_match = wg_int16;
              target_int8_match = wg_int8;
              break;
            default:
              break;
          }
          if (!int8 && !int16 && !(source_int16_match && target_int16_match)) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Size must be a multiple of 4";
          }
          if (value % 2 != 0) {
            if (!int8 && !(source_int8_match && target_int8_match)) {
              return _.diag(SPV_ERROR_INVALID_ID, inst)
                     << "Size must be a multiple of 2";
            }
          }
        }
      }
    }

    if (auto error = CheckMemoryAccess(_, inst, 3)) return error;
  }
  if (auto error = ValidateCopyMemoryMemoryAccess(_, inst)) return error;

  // Get past the pointers to avoid checking a pointer copy.
  if (target_pointer_type->opcode() == spv::Op::OpTypePointer) {
    auto sub_type = _.FindDef(target_pointer_type->GetOperandAs<uint32_t>(2));
    while (sub_type->opcode() == spv::Op::OpTypePointer) {
      sub_type = _.FindDef(sub_type->GetOperandAs<uint32_t>(2));
    }
    if (_.HasCapability(spv::Capability::Shader) &&
        _.ContainsLimitedUseIntOrFloatType(sub_type->id())) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Cannot copy memory of objects containing 8- or 16-bit types";
    }
  }

  return SPV_SUCCESS;
}